

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O1

void __thiscall hta::storage::file::Metric::flush(Metric *this)

{
  _Rb_tree_node_base *p_Var1;
  
  std::ostream::flush();
  File<hta::storage::file::Metric::Header,_hta::TimeValue>::check_stream(&this->file_raw_,"flush");
  for (p_Var1 = (this->files_hta_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->files_hta_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    std::ostream::flush();
    File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::check_stream
              ((File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *)&p_Var1[1]._M_parent,
               "flush");
  }
  return;
}

Assistant:

void Metric::flush()
{
    file_raw().flush();
    for (auto& elem : files_hta_)
    {
        elem.second.flush();
    }
}